

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status wal_copyto_snapshot(filemgr *file,snap_handle *shandle,bool is_multi_kv)

{
  fdb_txn *pfVar1;
  wal_item *item;
  bool bVar2;
  avl_node *node;
  size_t sVar3;
  fdb_txn *current_txn;
  avl_node **ppaVar4;
  ulong __size;
  fdb_kvs_id_t kv_id;
  fdb_doc doc;
  fdb_kvs_id_t local_b0;
  filemgr *local_a8;
  size_t local_a0;
  long local_98;
  size_t local_90;
  wal_item_header *local_88;
  fdb_doc local_80;
  
  local_b0 = 0;
  local_a0 = file->wal->num_shards;
  pfVar1 = &file->global_txn;
  (shandle->stat).wal_ndocs = 0;
  (shandle->stat).wal_ndeletes = 0;
  sVar3 = 0;
  local_a8 = file;
  do {
    if (sVar3 == local_a0) {
      return FDB_RESULT_SUCCESS;
    }
    local_90 = sVar3;
    pthread_spin_lock(&file->wal->key_shards[sVar3].lock);
    local_98 = sVar3 * 0x18;
    for (node = avl_first(&file->wal->key_shards[sVar3]._map); file = local_a8,
        node != (avl_node *)0x0; node = avl_next(node)) {
      if ((!is_multi_kv) ||
         (buf2kvid((ulong)*(byte *)((long)&node[1].left + 2),node[1].parent,&local_b0),
         local_b0 == shandle->id)) {
        ppaVar4 = &node[1].right;
        while (item = (wal_item *)*ppaVar4, item != (wal_item *)0x0) {
          if (((item->flag).super___atomic_base<unsigned_char>._M_i & 1) == 0) {
            current_txn = shandle->snap_txn;
            if (item->txn == current_txn || item->txn == pfVar1) goto LAB_0010db2d;
          }
          else {
            current_txn = shandle->snap_txn;
LAB_0010db2d:
            bVar2 = _wal_item_partially_committed
                              (shandle->global_txn,&shandle->active_txn_list,current_txn,item);
            if ((!bVar2) && (item->seqnum <= shandle->seqnum)) {
              local_88 = item->header;
              __size = (ulong)local_88->keylen;
              local_80.keylen = __size;
              local_80.key = malloc(__size);
              memcpy(local_80.key,local_88->key,__size);
              local_80.seqnum = item->seqnum;
              local_80.deleted = (byte)(item->action - 1) < 2;
              wal_snap_insert(shandle,&local_80,item->offset,item->action);
              break;
            }
          }
          ppaVar4 = (avl_node **)&(item->list_elem).next;
        }
      }
    }
    pthread_spin_unlock((pthread_spinlock_t *)((long)&local_a8->wal->key_shards->lock + local_98));
    sVar3 = local_90 + 1;
  } while( true );
}

Assistant:

fdb_status wal_copyto_snapshot(struct filemgr *file,
                               struct snap_handle *shandle,
                               bool is_multi_kv)
{
    struct list_elem *ee;
    struct avl_node *a;
    struct wal_item *item;
    struct wal_item_header *header;
    fdb_kvs_id_t kv_id = 0;
    fdb_doc doc;
    size_t i = 0;
    size_t num_shards = file->wal->num_shards;

    shandle->stat.wal_ndocs = 0; // WAL copy will populate
    shandle->stat.wal_ndeletes = 0; // these 2 stats

    // Get the list of active transactions now
    for (; i < num_shards; ++i) {
        spin_lock(&file->wal->key_shards[i].lock);
        a = avl_first(&file->wal->key_shards[i]._map);
        while (a) {
            header = _get_entry(a, struct wal_item_header, avl_key);
            if (is_multi_kv) {
                buf2kvid(header->chunksize, header->key, &kv_id);
                if (kv_id != shandle->id) {
                    a = avl_next(a);
                    continue;
                }
            }
            ee = list_begin(&header->items);
            while (ee) {
                item = _get_entry(ee, struct wal_item, list_elem);
                // Skip any uncommitted item, if not part of either global or
                // the current transaction
                if (!(item->flag & WAL_ITEM_COMMITTED) &&
                        item->txn != &file->global_txn &&
                        item->txn != shandle->snap_txn) {
                    ee = list_next(ee);
                    continue;
                }
                // Skip the partially committed items too.
                if (_wal_item_partially_committed(shandle->global_txn,
                                                  &shandle->active_txn_list,
                                                  shandle->snap_txn, item)) {
                    ee = list_next(ee);
                    continue;
                }

                if (item->seqnum > shandle->seqnum) {
                    ee = list_next(ee);
                    continue;
                }

                doc.keylen = item->header->keylen;
                doc.key = malloc(doc.keylen); // (freed in fdb_snapshot_close)
                memcpy(doc.key, item->header->key, doc.keylen);
                doc.seqnum = item->seqnum;
                doc.deleted = (item->action == WAL_ACT_LOGICAL_REMOVE ||
                               item->action == WAL_ACT_REMOVE);
                wal_snap_insert(shandle, &doc, item->offset, item->action);
                break; // We just require a single latest copy in the snapshot
            }
            a = avl_next(a);
        }
        spin_unlock(&file->wal->key_shards[i].lock);
    }
    return FDB_RESULT_SUCCESS;
}